

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  uint uVar1;
  long in_RSI;
  int in_EDI;
  Option opt;
  bool use_vulkan_compute;
  int cooling_down;
  int gpu_device;
  int powersave;
  int num_threads;
  int loop_count;
  size_t in_stack_fffffffffffff5a8;
  Option *in_stack_fffffffffffff5b0;
  int iVar2;
  undefined8 in_stack_fffffffffffff5b8;
  undefined1 *puVar3;
  Mat *in_stack_fffffffffffff5c0;
  Mat *this;
  undefined1 local_930 [72];
  undefined1 local_8e8 [72];
  undefined1 local_8a0 [72];
  Mat local_858 [2];
  Option *in_stack_fffffffffffff860;
  Mat *in_stack_fffffffffffff868;
  char *in_stack_fffffffffffff870;
  int local_24;
  uint local_20;
  uint local_18;
  int local_14;
  
  local_14 = 4;
  local_18 = ncnn::get_cpu_count();
  local_20 = 0xffffffff;
  local_24 = 1;
  if (1 < in_EDI) {
    local_14 = atoi(*(char **)(in_RSI + 8));
  }
  if (2 < in_EDI) {
    local_18 = atoi(*(char **)(in_RSI + 0x10));
  }
  if (3 < in_EDI) {
    atoi(*(char **)(in_RSI + 0x18));
  }
  if (4 < in_EDI) {
    local_20 = atoi(*(char **)(in_RSI + 0x20));
  }
  if (5 < in_EDI) {
    local_24 = atoi(*(char **)(in_RSI + 0x28));
  }
  g_enable_cooling_down = local_24 != 0;
  g_loop_count = local_14;
  ncnn::UnlockedPoolAllocator::set_size_compare_ratio
            ((UnlockedPoolAllocator *)in_stack_fffffffffffff5b0,
             (float)(in_stack_fffffffffffff5a8 >> 0x20));
  ncnn::PoolAllocator::set_size_compare_ratio
            ((PoolAllocator *)in_stack_fffffffffffff5b0,(float)(in_stack_fffffffffffff5a8 >> 0x20));
  ncnn::Option::Option(in_stack_fffffffffffff5b0);
  ncnn::set_cpu_powersave((int)in_stack_fffffffffffff5b0);
  iVar2 = (int)((ulong)in_stack_fffffffffffff5b0 >> 0x20);
  ncnn::set_omp_dynamic(0);
  ncnn::set_omp_num_threads(local_18);
  fprintf(_stderr,"loop_count = %d\n",(ulong)(uint)g_loop_count);
  fprintf(_stderr,"num_threads = %d\n",(ulong)local_18);
  __stream = _stderr;
  uVar1 = ncnn::get_cpu_powersave();
  fprintf(__stream,"powersave = %d\n",(ulong)uVar1);
  fprintf(_stderr,"gpu_device = %d\n",(ulong)local_20);
  fprintf(_stderr,"cooling_down = %d\n",(ulong)(g_enable_cooling_down & 1));
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x13ff98);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x13ffc3);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x13ffef);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14001a);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140046);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140071);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x14009d);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1400c8);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1400f4);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14011f);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x14014b);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140176);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1401a2);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1401cd);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1401f9);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140224);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140250);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14027b);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1402a7);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1402d2);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1402fe);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140329);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140355);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140380);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1403ac);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1403d7);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140403);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14042e);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x14045a);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140485);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1404ae);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1404d6);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1404ff);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140527);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140550);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140578);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1405a1);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1405c9);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1405f2);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14061a);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140643);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14066b);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140694);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1406bc);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1406e5);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14070d);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140736);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x14075e);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140787);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1407af);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1407d8);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140800);
  ncnn::Mat::Mat(in_stack_fffffffffffff5c0,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),
                 (int)in_stack_fffffffffffff5b8,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x140829);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140851);
  this = local_858;
  ncnn::Mat::Mat(this,(int)((ulong)in_stack_fffffffffffff5b8 >> 0x20),(int)in_stack_fffffffffffff5b8
                 ,iVar2,in_stack_fffffffffffff5a8,(Allocator *)0x14087a);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1408a2);
  puVar3 = local_8a0;
  ncnn::Mat::Mat(this,(int)((ulong)puVar3 >> 0x20),(int)puVar3,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x1408cb);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x1408f3);
  iVar2 = (int)((ulong)local_8e8 >> 0x20);
  ncnn::Mat::Mat(this,(int)((ulong)puVar3 >> 0x20),(int)puVar3,iVar2,in_stack_fffffffffffff5a8,
                 (Allocator *)0x14091c);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140944);
  ncnn::Mat::Mat(this,(int)((ulong)puVar3 >> 0x20),(int)puVar3,iVar2,(size_t)local_930,
                 (Allocator *)0x14096c);
  benchmark(in_stack_fffffffffffff870,in_stack_fffffffffffff868,in_stack_fffffffffffff860);
  ncnn::Mat::~Mat((Mat *)0x140993);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    int loop_count = 4;
    int num_threads = ncnn::get_cpu_count();
    int powersave = 0;
    int gpu_device = -1;
    int cooling_down = 1;

    if (argc >= 2)
    {
        loop_count = atoi(argv[1]);
    }
    if (argc >= 3)
    {
        num_threads = atoi(argv[2]);
    }
    if (argc >= 4)
    {
        powersave = atoi(argv[3]);
    }
    if (argc >= 5)
    {
        gpu_device = atoi(argv[4]);
    }
    if (argc >= 6)
    {
        cooling_down = atoi(argv[5]);
    }

#ifdef __EMSCRIPTEN__
    EM_ASM(
        FS.mkdir('/working');
        FS.mount(NODEFS, {root: '.'}, '/working'););
#endif // __EMSCRIPTEN__

    bool use_vulkan_compute = gpu_device != -1;

    g_enable_cooling_down = cooling_down != 0;

    g_loop_count = loop_count;

    g_blob_pool_allocator.set_size_compare_ratio(0.0f);
    g_workspace_pool_allocator.set_size_compare_ratio(0.5f);

#if NCNN_VULKAN
    if (use_vulkan_compute)
    {
        g_warmup_loop_count = 10;

        g_vkdev = ncnn::get_gpu_device(gpu_device);

        g_blob_vkallocator = new ncnn::VkBlobAllocator(g_vkdev);
        g_staging_vkallocator = new ncnn::VkStagingAllocator(g_vkdev);
    }
#endif // NCNN_VULKAN

    // default option
    ncnn::Option opt;
    opt.lightmode = true;
    opt.num_threads = num_threads;
    opt.blob_allocator = &g_blob_pool_allocator;
    opt.workspace_allocator = &g_workspace_pool_allocator;
#if NCNN_VULKAN
    opt.blob_vkallocator = g_blob_vkallocator;
    opt.workspace_vkallocator = g_blob_vkallocator;
    opt.staging_vkallocator = g_staging_vkallocator;
#endif // NCNN_VULKAN
    opt.use_winograd_convolution = true;
    opt.use_sgemm_convolution = true;
    opt.use_int8_inference = true;
    opt.use_vulkan_compute = use_vulkan_compute;
    opt.use_fp16_packed = true;
    opt.use_fp16_storage = true;
    opt.use_fp16_arithmetic = true;
    opt.use_int8_storage = true;
    opt.use_int8_arithmetic = true;
    opt.use_packing_layout = true;
    opt.use_shader_pack8 = false;
    opt.use_image_storage = false;

    ncnn::set_cpu_powersave(powersave);

    ncnn::set_omp_dynamic(0);
    ncnn::set_omp_num_threads(num_threads);

    fprintf(stderr, "loop_count = %d\n", g_loop_count);
    fprintf(stderr, "num_threads = %d\n", num_threads);
    fprintf(stderr, "powersave = %d\n", ncnn::get_cpu_powersave());
    fprintf(stderr, "gpu_device = %d\n", gpu_device);
    fprintf(stderr, "cooling_down = %d\n", (int)g_enable_cooling_down);

    // run
    benchmark("squeezenet", ncnn::Mat(227, 227, 3), opt);

    benchmark("squeezenet_int8", ncnn::Mat(227, 227, 3), opt);

    benchmark("mobilenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_v2", ncnn::Mat(224, 224, 3), opt);

    // benchmark("mobilenet_v2_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_v3", ncnn::Mat(224, 224, 3), opt);

    benchmark("shufflenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("shufflenet_v2", ncnn::Mat(224, 224, 3), opt);

    benchmark("mnasnet", ncnn::Mat(224, 224, 3), opt);

    benchmark("proxylessnasnet", ncnn::Mat(224, 224, 3), opt);

    benchmark("efficientnet_b0", ncnn::Mat(224, 224, 3), opt);

    benchmark("efficientnetv2_b0", ncnn::Mat(224, 224, 3), opt);

    benchmark("regnety_400m", ncnn::Mat(224, 224, 3), opt);

    benchmark("blazeface", ncnn::Mat(128, 128, 3), opt);

    benchmark("googlenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("googlenet_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet18", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet18_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("alexnet", ncnn::Mat(227, 227, 3), opt);

    benchmark("vgg16", ncnn::Mat(224, 224, 3), opt);

    benchmark("vgg16_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet50", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet50_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("squeezenet_ssd", ncnn::Mat(300, 300, 3), opt);

    benchmark("squeezenet_ssd_int8", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_ssd", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_ssd_int8", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_yolo", ncnn::Mat(416, 416, 3), opt);

    benchmark("mobilenetv2_yolov3", ncnn::Mat(352, 352, 3), opt);

    benchmark("yolov4-tiny", ncnn::Mat(416, 416, 3), opt);

    benchmark("nanodet_m", ncnn::Mat(320, 320, 3), opt);

#if NCNN_VULKAN
    delete g_blob_vkallocator;
    delete g_staging_vkallocator;
#endif // NCNN_VULKAN

    return 0;
}